

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_reboot(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *ch_00;
  bool bVar1;
  int iVar2;
  byte bVar3;
  char *txt;
  AREA_DATA_conflict *pAVar4;
  basic_string_view<char> format;
  basic_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> args;
  string area;
  char arg1 [4608];
  char send [4608];
  CHAR_DATA *in_stack_ffffffffffffd938;
  long *local_26b8 [2];
  long local_26a8 [2];
  long *local_2698 [2];
  long local_2688 [2];
  char *local_2678;
  CHAR_DATA *local_2670;
  char *local_2668 [3];
  buffer<char> local_2650;
  char local_2630 [504];
  char local_2438 [4608];
  char local_1238 [4616];
  
  local_2670 = ch;
  local_2678 = one_argument(argument,local_2438);
  iVar2 = atoi(local_2438);
  local_26b8[0] = local_26a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_26b8,"");
  if (area_first == (AREA_DATA_conflict *)0x0) {
    bVar3 = 0;
  }
  else {
    bVar3 = 0;
    pAVar4 = area_first;
    do {
      if ((pAVar4->area_flags[0] & 0x18) != 0) {
        local_2668[0] = pAVar4->name;
        local_2650.size_ = 0;
        local_2650._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
        local_2650.capacity_ = 500;
        format.size_ = 6;
        format.data_ = "%24s\n\r";
        args.field_1.values_ =
             (value<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *)local_2668;
        args.desc_ = 0xc;
        local_2650.ptr_ = local_2630;
        fmt::v9::detail::vprintf<char,fmt::v9::basic_printf_context<fmt::v9::appender,char>>
                  (&local_2650,format,args);
        local_2698[0] = local_2688;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2698,local_2650.ptr_,local_2650.ptr_ + local_2650.size_);
        if (local_2650.ptr_ != local_2630) {
          operator_delete(local_2650.ptr_,local_2650.capacity_);
        }
        std::__cxx11::string::_M_append((char *)local_26b8,(ulong)local_2698[0]);
        if (local_2698[0] != local_2688) {
          operator_delete(local_2698[0],local_2688[0] + 1);
        }
        bVar3 = 1;
      }
      pAVar4 = pAVar4->next;
    } while (pAVar4 != (AREA_DATA_conflict *)0x0);
  }
  bVar1 = str_cmp(local_2678,"now");
  ch_00 = local_2670;
  if ((bVar1) && (bVar1 = str_cmp(local_2438,"now"), (bVar1 & bVar3) == 1)) {
    send_to_char("The following areas have had changes made and need to be saved.  If you want\n\rto override, specify \'now\' after your reboot command.\n\r"
                 ,ch_00);
    send_to_char((char *)local_26b8[0],ch_00);
  }
  else {
    if ((rebooting & iVar2 != -1) == 0) {
      if (rebooting != false || -1 < iVar2) {
        rebooting = true;
        if (iVar2 == -1) {
          sprintf(local_1238,"{R%s has cancelled the reboot.{x",ch_00->true_name);
          do_immecho(ch_00,local_1238);
          reboot_num = -1;
          rebooting = false;
        }
        else if (iVar2 == 0) {
          reboot_now(ch_00);
        }
        else {
          reboot_num = iVar2;
          start_reboot(in_stack_ffffffffffffd938);
        }
        goto LAB_0026be06;
      }
      txt = "There is no reboot in progress to cancel.\n\r";
    }
    else {
      txt = "Someone has already started a reboot.\n\r";
    }
    send_to_char(txt,ch_00);
  }
LAB_0026be06:
  if (local_26b8[0] != local_26a8) {
    operator_delete(local_26b8[0],local_26a8[0] + 1);
  }
  return;
}

Assistant:

void do_reboot(CHAR_DATA *ch, char *argument)
{
	int mins = 0;
	char send[MSL];
	char arg1[MSL];
	AREA_DATA *pArea = nullptr;
	bool found = false;

	argument = one_argument(argument, arg1);
	mins = atoi(arg1);

	std::string area = std::string("");
	for (pArea = area_first; pArea != nullptr; pArea = pArea->next)
	{
		if (IS_SET(pArea->area_flags, AREA_CHANGED) || IS_SET(pArea->area_flags, AREA_ADDED))
		{
			found = true;
			area += fmt::sprintf("%24s\n\r", pArea->name);
		}
	}

	if ((str_cmp(argument, "now") && str_cmp(arg1, "now")) && found)
	{
		send_to_char("The following areas have had changes made and need to be saved.  If you want\n\rto override, specify 'now' after your reboot command.\n\r", ch);
		send_to_char(area.c_str(), ch);
		return;
	}

	if (rebooting && mins != -1)
	{
		send_to_char("Someone has already started a reboot.\n\r", ch);
		return;
	}

	if (!rebooting && mins < 0)
	{
		send_to_char("There is no reboot in progress to cancel.\n\r", ch);
		return;
	}

	rebooting = true;

	if (mins == 0)
	{
		reboot_now(ch);
	}
	else if (mins == -1)
	{
		sprintf(send, "{R%s has cancelled the reboot.{x", ch->true_name);
		do_immecho(ch, send);
		reboot_num = -1;
		rebooting = false;
	}
	else
	{
		reboot_num = mins;
		start_reboot(ch);
	}
}